

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

int cvui::printf(char *__format,...)

{
  int theY;
  char in_AL;
  int iVar1;
  cvui_block_t *theBlock;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  double in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  allocator<char> local_69;
  String local_68;
  undefined4 local_48;
  undefined4 local_44;
  va_list aArgs;
  cvui_block_t *aBlock;
  char *theFmt_local;
  uint theColor_local;
  double theFontScale_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  local_128 = in_RDX;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  theBlock = internal::topBlock();
  aArgs[0].overflow_arg_area = local_138;
  aArgs[0]._0_8_ = &stack0x00000008;
  local_44 = 0x40;
  local_48 = 0x10;
  vsprintf(internal::gBuffer,in_RSI,&local_48);
  iVar1 = (theBlock->anchor).x;
  theY = (theBlock->anchor).y;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,internal::gBuffer,&local_69);
  internal::text(theBlock,iVar1,theY,&local_68,in_XMM0_Qa,(uint)__format,true);
  std::__cxx11::string::~string((string *)&local_68);
  iVar1 = std::allocator<char>::~allocator(&local_69);
  return iVar1;
}

Assistant:

void printf(double theFontScale, unsigned int theColor, const char *theFmt, ...) {
	cvui_block_t& aBlock = internal::topBlock();
	va_list aArgs;

	va_start(aArgs, theFmt);
	vsprintf_s(internal::gBuffer, theFmt, aArgs);
	va_end(aArgs);

	internal::text(aBlock, aBlock.anchor.x, aBlock.anchor.y, internal::gBuffer, theFontScale, theColor, true);
}